

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::DictionaryTypeHandlerBase<int>::DumpFixedFields(DictionaryTypeHandlerBase<int> *this)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar6;
  DictionaryPropertyDescriptor<int> *pDVar7;
  PropertyRecord **ppPVar8;
  char16 *pcVar9;
  PropertyRecord *propertyRecord;
  DictionaryPropertyDescriptor<int> descriptor;
  int i;
  DictionaryTypeHandlerBase<int> *this_local;
  
  descriptor.Getter = 0;
  unique0x10000169 = this;
  while( true ) {
    iVar1 = descriptor.Getter;
    pBVar6 = Memory::
             WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
             ::operator->(&this->propertyMap);
    iVar5 = JsUtil::
            BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Count(pBVar6);
    if (iVar5 <= iVar1) break;
    pBVar6 = Memory::
             WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
             ::operator->(&this->propertyMap);
    pDVar7 = JsUtil::
             BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::GetValueAt(pBVar6,descriptor.Getter);
    propertyRecord._4_1_ = pDVar7->flags;
    propertyRecord._5_1_ = pDVar7->Attributes;
    propertyRecord._6_2_ = *(undefined2 *)&pDVar7->field_0x2;
    unique0x00012004 = pDVar7->Data;
    descriptor._0_8_ = *(undefined8 *)&pDVar7->Getter;
    pBVar6 = Memory::
             WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
             ::operator->(&this->propertyMap);
    ppPVar8 = JsUtil::
              BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::GetKeyAt(pBVar6,descriptor.Getter);
    pcVar9 = PropertyRecord::GetBuffer(*ppPVar8);
    bVar2 = DictionaryPropertyDescriptor<int>::GetIsInitialized
                      ((DictionaryPropertyDescriptor<int> *)((long)&propertyRecord + 4));
    bVar3 = DictionaryPropertyDescriptor<int>::GetIsFixed
                      ((DictionaryPropertyDescriptor<int> *)((long)&propertyRecord + 4));
    bVar4 = DictionaryPropertyDescriptor<int>::GetUsedAsFixed
                      ((DictionaryPropertyDescriptor<int> *)((long)&propertyRecord + 4));
    Output::Print(L" %s %d%d%d,",pcVar9,(ulong)bVar2,(ulong)bVar3,(ulong)bVar4);
    descriptor.Getter = descriptor.Getter + 1;
  }
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::DumpFixedFields() const {
        for (int i = 0; i < propertyMap->Count(); i++)
        {
            DictionaryPropertyDescriptor<T> descriptor = propertyMap->GetValueAt(i);

            const PropertyRecord* propertyRecord = propertyMap->GetKeyAt(i);
            Output::Print(_u(" %s %d%d%d,"), propertyRecord->GetBuffer(),
                descriptor.GetIsInitialized() ? 1 : 0,
                descriptor.GetIsFixed() ? 1 : 0,
                descriptor.GetUsedAsFixed() ? 1 : 0);
        }
    }